

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O0

void default_encrypt_cid(quicly_cid_encryptor_t *_self,quicly_cid_t *encrypted,void *reset_token,
                        quicly_cid_plaintext_t *plaintext)

{
  uint8_t *puVar1;
  uint32_t *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint8_t *p;
  uint8_t buf [16];
  st_quicly_default_encrypt_cid_t *self;
  size_t len;
  void *in_stack_ffffffffffffffc8;
  st_quicly_default_encrypt_cid_t *in_stack_ffffffffffffffd0;
  
  puVar1 = &stack0xffffffffffffffc8;
  len = *(size_t *)(**(long **)(in_RDI + 0x18) + 0x10);
  if (len != 8) {
    if (len != 0x10) {
      __assert_fail("!\"unexpected block size\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                    ,0x80,
                    "void default_encrypt_cid(quicly_cid_encryptor_t *, quicly_cid_t *, void *, const quicly_cid_plaintext_t *)"
                   );
    }
    puVar1 = quicly_encode64(puVar1,*(uint64_t *)(in_RCX + 2));
  }
  puVar1 = quicly_encode32(puVar1,*in_RCX);
  puVar1 = quicly_encode32(puVar1,in_RCX[1] & 0xffffff00 | in_RCX[1] & 0xff);
  if ((long)puVar1 - (long)&stack0xffffffffffffffc8 != *(long *)(**(long **)(in_RDI + 0x18) + 0x10))
  {
    __assert_fail("p - buf == self->cid_encrypt_ctx->algo->block_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                  ,0x85,
                  "void default_encrypt_cid(quicly_cid_encryptor_t *, quicly_cid_t *, void *, const quicly_cid_plaintext_t *)"
                 );
  }
  ptls_cipher_encrypt((ptls_cipher_context_t *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                      puVar1,len);
  *(char *)(in_RSI + 0x14) = (char)*(undefined8 *)(**(long **)(in_RDI + 0x18) + 0x10);
  if (in_RDX != 0) {
    generate_reset_token(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,puVar1);
  }
  return;
}

Assistant:

static void default_encrypt_cid(quicly_cid_encryptor_t *_self, quicly_cid_t *encrypted, void *reset_token,
                                const quicly_cid_plaintext_t *plaintext)
{
    struct st_quicly_default_encrypt_cid_t *self = (void *)_self;
    uint8_t buf[16], *p;

    /* encode */
    p = buf;
    switch (self->cid_encrypt_ctx->algo->block_size) {
    case 8:
        break;
    case 16:
        p = quicly_encode64(p, plaintext->node_id);
        break;
    default:
        assert(!"unexpected block size");
        break;
    }
    p = quicly_encode32(p, plaintext->master_id);
    p = quicly_encode32(p, (plaintext->thread_id << 8) | plaintext->path_id);
    assert(p - buf == self->cid_encrypt_ctx->algo->block_size);

    /* generate CID */
    ptls_cipher_encrypt(self->cid_encrypt_ctx, encrypted->cid, buf, self->cid_encrypt_ctx->algo->block_size);
    encrypted->len = self->cid_encrypt_ctx->algo->block_size;

    /* generate stateless reset token if requested */
    if (reset_token != NULL)
        generate_reset_token(self, reset_token, encrypted->cid);
}